

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void testing::internal::TuplePrefix<3ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<mp::expr::Kind>,testing::Matcher<BasicTestExpr<2>>,testing::Matcher<BasicTestExpr<2>>>,std::tuple<mp::expr::Kind,BasicTestExpr<2>,BasicTestExpr<2>>>
               (tuple<testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
                *matchers,tuple<mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>_> *values,
               ostream *os)

{
  IDType IVar1;
  MatcherInterface<BasicTestExpr<2>_> *pMVar2;
  int iVar3;
  ostream *poVar4;
  Value value;
  type matcher;
  string local_1d8;
  StringMatchResultListener listener;
  
  TuplePrefix<2ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<mp::expr::Kind>,testing::Matcher<BasicTestExpr<2>>,testing::Matcher<BasicTestExpr<2>>>,std::tuple<mp::expr::Kind,BasicTestExpr<2>,BasicTestExpr<2>>>
            (matchers,values,os);
  Matcher<BasicTestExpr<2>_>::Matcher(&matcher,(Matcher<BasicTestExpr<2>_> *)matchers);
  IVar1 = (values->super__Tuple_impl<0UL,_mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>_>).
          super__Tuple_impl<1UL,_BasicTestExpr<2>,_BasicTestExpr<2>_>.
          super__Tuple_impl<2UL,_BasicTestExpr<2>_>.super__Head_base<2UL,_BasicTestExpr<2>,_false>.
          _M_head_impl.id_;
  value.id_ = IVar1;
  StringMatchResultListener::StringMatchResultListener(&listener);
  iVar3 = (*((matcher.super_MatcherBase<BasicTestExpr<2>_>.impl_.value_)->
            super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                    (matcher.super_MatcherBase<BasicTestExpr<2>_>.impl_.value_,(ulong)IVar1,
                     &listener);
  if ((char)iVar3 == '\0') {
    poVar4 = std::operator<<(os,"  Expected arg #");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4,": ");
    pMVar2 = (matchers->
             super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
             ).
             super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
             .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<2>_>_>.
             super__Head_base<2UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl.
             super_MatcherBase<BasicTestExpr<2>_>.impl_.value_;
    (*(pMVar2->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[2])(pMVar2,os);
    std::operator<<(os,"\n           Actual: ");
    internal2::TypeWithoutFormatter<BasicTestExpr<2>,_(testing::internal2::TypeKind)2>::PrintValue
              (&value,os);
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1d8,os);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::operator<<(os,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(&listener);
  MatcherBase<BasicTestExpr<2>_>::~MatcherBase(&matcher.super_MatcherBase<BasicTestExpr<2>_>);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }